

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall
el::base::utils::RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>::deepCopy
          (RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate> *this,
          AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
          *sr)

{
  bool bVar1;
  reference ppHVar2;
  long *in_RSI;
  long *in_RDI;
  const_iterator it;
  HitCounter *in_stack_ffffffffffffffb8;
  HitCounter *in_stack_ffffffffffffffc0;
  __normal_iterator<el::base::HitCounter_*const_*,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  local_18;
  long *local_10;
  
  local_10 = in_RSI;
  (**(code **)(*in_RSI + 0x60))();
  local_18._M_current =
       (HitCounter **)
       std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>::begin
                 ((vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_> *)
                  in_stack_ffffffffffffffb8);
  while( true ) {
    (**(code **)(*local_10 + 0x60))();
    std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>::end
              ((vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_> *)
               in_stack_ffffffffffffffb8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<el::base::HitCounter_*const_*,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<el::base::HitCounter_*const_*,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    in_stack_ffffffffffffffb8 = (HitCounter *)operator_new(0x20);
    in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffb8;
    ppHVar2 = __gnu_cxx::
              __normal_iterator<el::base::HitCounter_*const_*,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
              ::operator*(&local_18);
    HitCounter::HitCounter(in_stack_ffffffffffffffc0,*ppHVar2);
    (**(code **)(*in_RDI + 0x80))(in_RDI,in_stack_ffffffffffffffb8);
    __gnu_cxx::
    __normal_iterator<el::base::HitCounter_*const_*,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

virtual void deepCopy(const AbstractRegistry<T_Ptr, std::vector<T_Ptr*>>& sr) {
    for (const_iterator it = sr.list().begin(); it != sr.list().end(); ++it) {
      registerNew(new T_Ptr(**it));
    }
  }